

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O2

ssize_t __thiscall
duckdb_parquet::MicroSeconds::read(MicroSeconds *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 in_register_00000034;
  TProtocol *this_00;
  TType ftype;
  int16_t fid;
  string fname;
  int local_58;
  undefined1 local_52 [2];
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40 [16];
  
  this_00 = (TProtocol *)CONCAT44(in_register_00000034,__fd);
  duckdb_apache::thrift::protocol::TProtocol::incrementInputRecursionDepth(this_00);
  local_50 = local_40;
  local_48 = 0;
  local_40[0] = 0;
  iVar1 = (*this_00->_vptr_TProtocol[0x19])(this_00,&local_50);
  while( true ) {
    iVar2 = (*this_00->_vptr_TProtocol[0x1b])(this_00,&local_50,&local_58,local_52);
    if (local_58 == 0) break;
    iVar3 = (*this_00->_vptr_TProtocol[0x2c])(this_00);
    iVar4 = (*this_00->_vptr_TProtocol[0x1c])(this_00);
    iVar1 = iVar3 + iVar2 + iVar1 + iVar4;
  }
  iVar3 = (*this_00->_vptr_TProtocol[0x1a])(this_00);
  std::__cxx11::string::~string((string *)&local_50);
  this_00->input_recursion_depth_ = this_00->input_recursion_depth_ - 1;
  return (ulong)(uint)(iVar3 + iVar2 + iVar1);
}

Assistant:

uint32_t MicroSeconds::read(::apache::thrift::protocol::TProtocol* iprot) {

  ::apache::thrift::protocol::TInputRecursionTracker tracker(*iprot);
  uint32_t xfer = 0;
  std::string fname;
  ::apache::thrift::protocol::TType ftype;
  int16_t fid;

  xfer += iprot->readStructBegin(fname);

  using ::apache::thrift::protocol::TProtocolException;


  while (true)
  {
    xfer += iprot->readFieldBegin(fname, ftype, fid);
    if (ftype == ::apache::thrift::protocol::T_STOP) {
      break;
    }
    xfer += iprot->skip(ftype);
    xfer += iprot->readFieldEnd();
  }

  xfer += iprot->readStructEnd();

  return xfer;
}